

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chaiscript::AST_Node>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_chaiscript::AST_Node>_>
           *this)

{
  Proxy_Function_Base::~Proxy_Function_Base((Proxy_Function_Base *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}